

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

Precision __thiscall
spirv_cross::CompilerGLSL::analyze_expression_precision
          (CompilerGLSL *this,uint32_t *args,uint32_t length)

{
  bool bVar1;
  Variant *this_00;
  ID local_38;
  Types local_34;
  uint local_30;
  Types handle_type;
  uint32_t arg;
  uint32_t i;
  bool expression_has_mediump;
  bool expression_has_highp;
  uint32_t *puStack_20;
  uint32_t length_local;
  uint32_t *args_local;
  CompilerGLSL *this_local;
  
  arg._3_1_ = 0;
  arg._2_1_ = 0;
  i = length;
  puStack_20 = args;
  args_local = (uint32_t *)this;
  for (handle_type = TypeNone; handle_type < i; handle_type = handle_type + TypeType) {
    local_30 = puStack_20[handle_type];
    this_00 = VectorView<spirv_cross::Variant>::operator[]
                        (&(this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>,
                         (ulong)local_30);
    local_34 = Variant::get_type(this_00);
    if (((local_34 != TypeConstant) && (local_34 != TypeConstantOp)) && (local_34 != TypeUndef)) {
      TypedID<(spirv_cross::Types)0>::TypedID(&local_38,local_30);
      bVar1 = Compiler::has_decoration(&this->super_Compiler,local_38,DecorationRelaxedPrecision);
      if (bVar1) {
        arg._2_1_ = 1;
      }
      else {
        arg._3_1_ = 1;
      }
    }
  }
  if ((arg._3_1_ & 1) == 0) {
    if ((arg._2_1_ & 1) == 0) {
      this_local._4_4_ = DontCare;
    }
    else {
      this_local._4_4_ = Mediump;
    }
  }
  else {
    this_local._4_4_ = Highp;
  }
  return this_local._4_4_;
}

Assistant:

CompilerGLSL::Options::Precision CompilerGLSL::analyze_expression_precision(const uint32_t *args, uint32_t length) const
{
	// Now, analyze the precision at which the arguments would run.
	// GLSL rules are such that the precision used to evaluate an expression is equal to the highest precision
	// for the inputs. Constants do not have inherent precision and do not contribute to this decision.
	// If all inputs are constants, they inherit precision from outer expressions, including an l-value.
	// In this case, we'll have to force a temporary for dst_id so that we can bind the constant expression with
	// correct precision.
	bool expression_has_highp = false;
	bool expression_has_mediump = false;

	for (uint32_t i = 0; i < length; i++)
	{
		uint32_t arg = args[i];

		auto handle_type = ir.ids[arg].get_type();
		if (handle_type == TypeConstant || handle_type == TypeConstantOp || handle_type == TypeUndef)
			continue;

		if (has_decoration(arg, DecorationRelaxedPrecision))
			expression_has_mediump = true;
		else
			expression_has_highp = true;
	}

	if (expression_has_highp)
		return Options::Highp;
	else if (expression_has_mediump)
		return Options::Mediump;
	else
		return Options::DontCare;
}